

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall spvtools::opt::Instruction::AddDebugLine(Instruction *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  reference pvVar4;
  DefUseManager *this_00;
  Instruction *inst_local;
  Instruction *this_local;
  
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::push_back
            (&this->dbg_line_insts_,inst);
  pIVar3 = context(this);
  uVar2 = IRContext::TakeNextUniqueId(pIVar3);
  pvVar4 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
           back(&this->dbg_line_insts_);
  pvVar4->unique_id_ = uVar2;
  bVar1 = IsDebugLineInst(inst);
  if (bVar1) {
    pvVar4 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
             back(&this->dbg_line_insts_);
    uVar2 = IRContext::TakeNextId(this->context_);
    SetResultId(pvVar4,uVar2);
  }
  pIVar3 = context(this);
  bVar1 = IRContext::AreAnalysesValid(pIVar3,kAnalysisBegin);
  if (bVar1) {
    pIVar3 = context(this);
    this_00 = IRContext::get_def_use_mgr(pIVar3);
    pvVar4 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
             back(&this->dbg_line_insts_);
    analysis::DefUseManager::AnalyzeInstDefUse(this_00,pvVar4);
  }
  return;
}

Assistant:

void Instruction::AddDebugLine(const Instruction* inst) {
  dbg_line_insts_.push_back(*inst);
  dbg_line_insts_.back().unique_id_ = context()->TakeNextUniqueId();
  if (inst->IsDebugLineInst())
    dbg_line_insts_.back().SetResultId(context_->TakeNextId());
  if (context()->AreAnalysesValid(IRContext::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(&dbg_line_insts_.back());
}